

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_slist.c
# Opt level: O0

void * ares_slist_node_claim(ares_slist_node_t *node)

{
  ares_slist_t *paVar1;
  void *val;
  ares_slist_t *list;
  ares_slist_node_t *node_local;
  
  if (node == (ares_slist_node_t *)0x0) {
    node_local = (ares_slist_node_t *)0x0;
  }
  else {
    paVar1 = node->parent;
    node_local = (ares_slist_node_t *)node->data;
    ares_slist_node_pop(node);
    ares_free(node->next);
    ares_free(node->prev);
    ares_free(node);
    paVar1->cnt = paVar1->cnt - 1;
  }
  return node_local;
}

Assistant:

void *ares_slist_node_claim(ares_slist_node_t *node)
{
  ares_slist_t *list;
  void         *val;

  if (node == NULL) {
    return NULL;
  }

  list = node->parent;
  val  = node->data;

  ares_slist_node_pop(node);

  ares_free(node->next);
  ares_free(node->prev);
  ares_free(node);

  list->cnt--;

  return val;
}